

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void glad_gl_load_GL_VERSION_3_1(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_VERSION_3_1 != 0) {
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC)(*load)(userptr,"glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC)(*load)(userptr,"glBindBufferRange");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC)(*load)(userptr,"glCopyBufferSubData");
    glad_glDrawArraysInstanced =
         (PFNGLDRAWARRAYSINSTANCEDPROC)(*load)(userptr,"glDrawArraysInstanced");
    glad_glDrawElementsInstanced =
         (PFNGLDRAWELEMENTSINSTANCEDPROC)(*load)(userptr,"glDrawElementsInstanced");
    glad_glGetActiveUniformBlockName =
         (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC)(*load)(userptr,"glGetActiveUniformBlockName");
    glad_glGetActiveUniformBlockiv =
         (PFNGLGETACTIVEUNIFORMBLOCKIVPROC)(*load)(userptr,"glGetActiveUniformBlockiv");
    glad_glGetActiveUniformName =
         (PFNGLGETACTIVEUNIFORMNAMEPROC)(*load)(userptr,"glGetActiveUniformName");
    glad_glGetActiveUniformsiv =
         (PFNGLGETACTIVEUNIFORMSIVPROC)(*load)(userptr,"glGetActiveUniformsiv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC)(*load)(userptr,"glGetIntegeri_v");
    glad_glGetUniformBlockIndex =
         (PFNGLGETUNIFORMBLOCKINDEXPROC)(*load)(userptr,"glGetUniformBlockIndex");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC)(*load)(userptr,"glGetUniformIndices");
    glad_glPrimitiveRestartIndex =
         (PFNGLPRIMITIVERESTARTINDEXPROC)(*load)(userptr,"glPrimitiveRestartIndex");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC)(*load)(userptr,"glTexBuffer");
    glad_glUniformBlockBinding =
         (PFNGLUNIFORMBLOCKBINDINGPROC)(*load)(userptr,"glUniformBlockBinding");
  }
  return;
}

Assistant:

static void glad_gl_load_GL_VERSION_3_1( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_VERSION_3_1) return;
    glad_glBindBufferBase = (PFNGLBINDBUFFERBASEPROC) load(userptr, "glBindBufferBase");
    glad_glBindBufferRange = (PFNGLBINDBUFFERRANGEPROC) load(userptr, "glBindBufferRange");
    glad_glCopyBufferSubData = (PFNGLCOPYBUFFERSUBDATAPROC) load(userptr, "glCopyBufferSubData");
    glad_glDrawArraysInstanced = (PFNGLDRAWARRAYSINSTANCEDPROC) load(userptr, "glDrawArraysInstanced");
    glad_glDrawElementsInstanced = (PFNGLDRAWELEMENTSINSTANCEDPROC) load(userptr, "glDrawElementsInstanced");
    glad_glGetActiveUniformBlockName = (PFNGLGETACTIVEUNIFORMBLOCKNAMEPROC) load(userptr, "glGetActiveUniformBlockName");
    glad_glGetActiveUniformBlockiv = (PFNGLGETACTIVEUNIFORMBLOCKIVPROC) load(userptr, "glGetActiveUniformBlockiv");
    glad_glGetActiveUniformName = (PFNGLGETACTIVEUNIFORMNAMEPROC) load(userptr, "glGetActiveUniformName");
    glad_glGetActiveUniformsiv = (PFNGLGETACTIVEUNIFORMSIVPROC) load(userptr, "glGetActiveUniformsiv");
    glad_glGetIntegeri_v = (PFNGLGETINTEGERI_VPROC) load(userptr, "glGetIntegeri_v");
    glad_glGetUniformBlockIndex = (PFNGLGETUNIFORMBLOCKINDEXPROC) load(userptr, "glGetUniformBlockIndex");
    glad_glGetUniformIndices = (PFNGLGETUNIFORMINDICESPROC) load(userptr, "glGetUniformIndices");
    glad_glPrimitiveRestartIndex = (PFNGLPRIMITIVERESTARTINDEXPROC) load(userptr, "glPrimitiveRestartIndex");
    glad_glTexBuffer = (PFNGLTEXBUFFERPROC) load(userptr, "glTexBuffer");
    glad_glUniformBlockBinding = (PFNGLUNIFORMBLOCKBINDINGPROC) load(userptr, "glUniformBlockBinding");
}